

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManagement.cpp
# Opt level: O3

void __thiscall chatra::Scope::~Scope(Scope *this)

{
  SpinLock *pSVar1;
  atomic<int> *paVar2;
  __atomic_flag_data_type _Var3;
  Object *pOVar4;
  Storage *pSVar5;
  Reference RVar6;
  const_iterator cVar7;
  ulong uVar8;
  long lVar9;
  TypeId local_24;
  Reference local_20;
  Reference ref;
  
  if (((this->captured)._M_base._M_i & 1U) != 0) {
    local_20.node._0_4_ = 0x94;
    RVar6 = AsyncRead<std::unordered_map<chatra::StringId,chatra::Reference,std::hash<chatra::StringId>,std::equal_to<chatra::StringId>,std::allocator<std::pair<chatra::StringId_const,chatra::Reference>>>>
            ::
            read<chatra::Reference,chatra::Scope::ref(chatra::StringId)const::_lambda(std::unordered_map<chatra::StringId,chatra::Reference,std::hash<chatra::StringId>,std::equal_to<chatra::StringId>,std::allocator<std::pair<chatra::StringId_const,chatra::Reference>>>const&)_1_>
                      ((AsyncRead<std::unordered_map<chatra::StringId,chatra::Reference,std::hash<chatra::StringId>,std::equal_to<chatra::StringId>,std::allocator<std::pair<chatra::StringId_const,chatra::Reference>>>>
                        *)this,(anon_class_8_1_ba1d59bf)&local_20);
    pOVar4 = (RVar6.node)->object;
    local_20.node._0_4_ = 0x94;
    cVar7 = std::
            _Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_chatra::Reference>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(pOVar4->refsMap)._M_h,(key_type *)&local_20);
    if (cVar7.super__Node_iterator_base<std::pair<const_chatra::StringId,_chatra::Reference>,_false>
        ._M_cur == (__node_type *)0x0) {
      std::__throw_out_of_range("_Map_base::at");
    }
    local_20.node =
         *(ReferenceNode **)
          ((long)cVar7.
                 super__Node_iterator_base<std::pair<const_chatra::StringId,_chatra::Reference>,_false>
                 ._M_cur + 0x10);
    LOCK();
    paVar2 = &(this->
              super_AsyncRead<std::unordered_map<chatra::StringId,_chatra::Reference,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>_>_>
              ).readCount;
    (paVar2->super___atomic_base<int>)._M_i = (paVar2->super___atomic_base<int>)._M_i + 1;
    UNLOCK();
    local_24 = CapturedScopeObject;
    Reference::
    allocateWithoutLock<chatra::Object,chatra::TypeId,std::vector<std::unique_ptr<chatra::ReferenceGroup,std::default_delete<chatra::ReferenceGroup>>,std::allocator<std::unique_ptr<chatra::ReferenceGroup,std::default_delete<chatra::ReferenceGroup>>>>,std::vector<std::unique_ptr<chatra::ReferenceNode,std::default_delete<chatra::ReferenceNode>>,std::allocator<std::unique_ptr<chatra::ReferenceNode,std::default_delete<chatra::ReferenceNode>>>>,std::unordered_map<chatra::StringId,chatra::Reference,std::hash<chatra::StringId>,std::equal_to<chatra::StringId>,std::allocator<std::pair<chatra::StringId_const,chatra::Reference>>>const&>
              (&local_20,&local_24,&this->groups,&this->nodes,
               (this->
               super_AsyncRead<std::unordered_map<chatra::StringId,_chatra::Reference,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>_>_>
               ).valueForRead._M_b._M_p);
    LOCK();
    paVar2 = &(this->
              super_AsyncRead<std::unordered_map<chatra::StringId,_chatra::Reference,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>_>_>
              ).readCount;
    (paVar2->super___atomic_base<int>)._M_i = (paVar2->super___atomic_base<int>)._M_i + -1;
    UNLOCK();
    lVar9 = *(long *)&pOVar4[1].super_Lockable.lockCount;
    (&pOVar4[1]._vptr_Object)[lVar9] = (_func_int **)0x0;
    LOCK();
    pOVar4[1].objectIndex = (size_t)(&pOVar4[1]._vptr_Object + lVar9);
    UNLOCK();
    do {
    } while (0 < (int)pOVar4[1].gcGeneration);
    uVar8 = *(ulong *)&pOVar4[1].super_Lockable.lockCount ^ 1;
    *(ulong *)&pOVar4[1].super_Lockable.lockCount = uVar8;
    (&pOVar4[1]._vptr_Object)[uVar8] = (_func_int **)0x0;
  }
  pSVar5 = this->storage;
  do {
    LOCK();
    pSVar1 = &pSVar5->lockScopes;
    _Var3 = (pSVar1->flag).super___atomic_flag_base._M_i;
    (pSVar1->flag).super___atomic_flag_base._M_i = true;
    UNLOCK();
  } while (_Var3 != false);
  local_20.node = (ReferenceNode *)this;
  std::
  _Hashtable<chatra::Scope_*,_chatra::Scope_*,_std::allocator<chatra::Scope_*>,_std::__detail::_Identity,_std::equal_to<chatra::Scope_*>,_std::hash<chatra::Scope_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_M_erase(&(this->storage->scopes)._M_h);
  (pSVar5->lockScopes).flag.super___atomic_flag_base._M_i = false;
  std::
  vector<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>,_std::allocator<std::unique_ptr<chatra::ReferenceNode,_std::default_delete<chatra::ReferenceNode>_>_>_>
  ::~vector(&this->nodes);
  std::
  vector<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>,_std::allocator<std::unique_ptr<chatra::ReferenceGroup,_std::default_delete<chatra::ReferenceGroup>_>_>_>
  ::~vector(&this->groups);
  lVar9 = 0x38;
  do {
    std::
    _Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_chatra::Reference>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<chatra::StringId,_std::pair<const_chatra::StringId,_chatra::Reference>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>,_std::__detail::_Select1st,_std::equal_to<chatra::StringId>,_std::hash<chatra::StringId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)((long)&(this->
                             super_AsyncRead<std::unordered_map<chatra::StringId,_chatra::Reference,_std::hash<chatra::StringId>,_std::equal_to<chatra::StringId>,_std::allocator<std::pair<const_chatra::StringId,_chatra::Reference>_>_>_>
                             ).values[0]._M_h._M_buckets + lVar9));
    lVar9 = lVar9 + -0x38;
  } while (lVar9 != -0x38);
  return;
}

Assistant:

Scope::~Scope() {
	if (captured) {
		auto& capturedScope = this->ref(StringId::CapturedScope).derefWithoutLock<CapturedScope>();
		auto ref = capturedScope.ref(StringId::CapturedScope);
		read([&](const RefsContainer& refs) {
			ref.allocateWithoutLock<Object>(TypeId::CapturedScopeObject, std::move(groups), std::move(nodes), refs);
		});
		capturedScope.scope.write([](Scope*& scope) { scope = nullptr; });
	}

	{
		std::lock_guard<SpinLock> lock(storage.lockScopes);

		// Checking readCount outside lockScopes would be unsafe
		// because garbage collector may increment readCount asynchronously inside lockScopes
		chatra_assert(getReadCount() == 0);

		storage.scopes.erase(this);
	}
}